

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits_sse_uint16
                 (uint64_t *words,size_t length,uint16_t *out,size_t outcapacity,uint16_t base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  ushort uVar9;
  int iVar10;
  short *psVar11;
  long in_RCX;
  short *in_RDX;
  ulong in_RSI;
  long in_RDI;
  short in_R8W;
  int r;
  uint64_t w_1;
  uint8_t advanceB;
  uint8_t advanceA;
  __m128i vecB;
  __m128i vecA;
  uint8_t byteB;
  uint8_t byteA;
  int k;
  uint64_t w;
  size_t i;
  int numberofbytes;
  uint16_t *safeout;
  __m128i add8;
  __m128i incVec;
  __m128i baseVec;
  uint16_t *initout;
  unsigned_long_long local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  int local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  undefined1 local_198 [16];
  short local_17a;
  short *local_170;
  
  uVar9 = in_R8W - 1;
  auVar6 = vpinsrw_avx(ZEXT216(uVar9),(uint)uVar9,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,6);
  local_198 = vpinsrw_avx(auVar6,(uint)uVar9,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  auVar6 = vpinsrw_avx(auVar6,0x40,7);
  auVar7 = vpinsrw_avx(ZEXT216(8),8,1);
  auVar7 = vpinsrw_avx(auVar7,8,2);
  auVar7 = vpinsrw_avx(auVar7,8,3);
  auVar7 = vpinsrw_avx(auVar7,8,4);
  auVar7 = vpinsrw_avx(auVar7,8,5);
  auVar7 = vpinsrw_avx(auVar7,8,6);
  auVar7 = vpinsrw_avx(auVar7,8,7);
  psVar11 = in_RDX + in_RCX;
  local_170 = in_RDX;
  for (local_1d0 = 0; local_1d0 < in_RSI && local_170 + 0x10 <= psVar11; local_1d0 = local_1d0 + 1)
  {
    local_1d8 = *(ulong *)(in_RDI + local_1d0 * 8);
    if (local_1d8 == 0) {
      local_198 = vpaddw_avx(local_198,auVar6);
    }
    else {
      for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
        bVar8 = (byte)(local_1d8 >> 8);
        bVar1 = lengthTable[local_1d8 & 0xff];
        bVar2 = lengthTable[bVar8];
        auVar3 = vpaddw_avx(local_198,(undefined1  [16])vecDecodeTable_uint16[local_1d8 & 0xff]);
        auVar4 = vpaddw_avx(local_198,auVar7);
        auVar5 = vpaddw_avx(auVar4,(undefined1  [16])vecDecodeTable_uint16[bVar8]);
        local_198 = vpaddw_avx(auVar4,auVar7);
        local_1f8 = auVar3._0_8_;
        uStack_1f0 = auVar3._8_8_;
        *(undefined8 *)local_170 = local_1f8;
        *(undefined8 *)(local_170 + 4) = uStack_1f0;
        *(undefined1 (*) [16])(local_170 + (int)(uint)bVar1) = auVar5;
        local_170 = (short *)(*(undefined1 (*) [16])(local_170 + (int)(uint)bVar1) +
                             (long)(int)(uint)bVar2 * 2);
        local_1d8 = local_1d8 >> 0x10;
      }
    }
  }
  local_17a = in_R8W + (short)((local_1d0 & 0x3ff) << 6);
  for (; local_1d0 < in_RSI && local_170 < psVar11; local_1d0 = local_1d0 + 1) {
    for (local_218 = *(unsigned_long_long *)(in_RDI + local_1d0 * 8);
        local_218 != 0 && local_170 < psVar11; local_218 = local_218 - 1 & local_218) {
      iVar10 = roaring_trailing_zeroes(local_218);
      *local_170 = (short)iVar10 + local_17a;
      local_170 = local_170 + 1;
    }
    local_17a = local_17a + 0x40;
  }
  return (long)local_170 - (long)in_RDX >> 1;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_sse_uint16(const uint64_t *words, size_t length,
                                         uint16_t *out, size_t outcapacity,
                                         uint16_t base) {
    uint16_t *initout = out;
    __m128i baseVec = _mm_set1_epi16(base - 1);
    __m128i incVec = _mm_set1_epi16(64);
    __m128i add8 = _mm_set1_epi16(8);
    uint16_t *safeout = out + outcapacity;
    const int numberofbytes = 2;  // process two bytes at a time
    size_t i = 0;
    for (; (i < length) && (out + numberofbytes * 8 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm_add_epi16(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m128i vecA = _mm_loadu_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteA]);
                __m128i vecB = _mm_loadu_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm_add_epi16(baseVec, vecA);
                baseVec = _mm_add_epi16(baseVec, add8);
                vecB = _mm_add_epi16(baseVec, vecB);
                baseVec = _mm_add_epi16(baseVec, add8);
                _mm_storeu_si128((__m128i *)out, vecA);
                out += advanceA;
                _mm_storeu_si128((__m128i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += (uint16_t)(i * 64);
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            int r = roaring_trailing_zeroes(w);
            *out = (uint16_t)(r + base);
            out++;
            w &= (w - 1);
        }
        base += 64;
    }
    return out - initout;
}